

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O2

double Col_FloatWordValue(Col_Word word)

{
  uint uVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (word != 0) {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        return 0.0;
      }
      uVar1 = *(byte *)word & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)word & 0x1f];
    }
    dVar2 = 0.0;
    if (uVar1 == 2) {
      if (*(short *)(word + 2) == 8) {
        dVar2 = *(double *)(word + 0x10);
      }
    }
    else if (uVar1 == 0xfffffffd) {
      return (double)(word & 0xfffffffffffffffc);
    }
  }
  return dVar2;
}

Assistant:

double
Col_FloatWordValue(
    Col_Word word)  /*!< Floating point word to get value for. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_SMALLFP: {
        FloatConvert c;
        return WORD_SMALLFP_VALUE(word, c);
    }

    case WORD_TYPE_WRAP:
        if (WORD_WRAP_TYPE(word) == COL_FLOAT) {
            return WORD_FPWRAP_VALUE(word);
        }
    }

    /*! @typecheck{COL_ERROR_FLOAT,word} */
    TYPECHECK(0, COL_ERROR_FLOAT, word);
    
    return 0.0;
}